

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack22_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x400000 | uVar1 - base;
  uVar2 = in[1] - base >> 10;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x1000 | uVar2;
  uVar2 = in[2] - base >> 0x14;
  out[2] = uVar2;
  uVar2 = (in[3] - base) * 4 | uVar2;
  out[2] = uVar2;
  out[2] = (in[4] - base) * 0x1000000 | uVar2;
  uVar2 = in[4] - base >> 8;
  out[3] = uVar2;
  out[3] = (in[5] - base) * 0x4000 | uVar2;
  uVar2 = in[5] - base >> 0x12;
  out[4] = uVar2;
  uVar2 = (in[6] - base) * 0x10 | uVar2;
  out[4] = uVar2;
  out[4] = (in[7] - base) * 0x4000000 | uVar2;
  out[5] = in[7] - base >> 6;
  return out + 6;
}

Assistant:

uint32_t * pack22_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 22  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 22  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 22  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 22  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 22  -  16 );
    ++in;

    return out + 1;
}